

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O3

bool __thiscall Debugger::CreateEnv(Debugger *this,lua_State *L,int stackLevel)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  lua_Debug ar;
  lua_Debug local_480;
  
  if (L != (lua_State *)0x0) {
    memset(&local_480,0,0x450);
    iVar1 = (*lua_getstack)(L,stackLevel,&local_480);
    if (iVar1 == 0) {
      return false;
    }
    iVar1 = (*lua_getinfo)(L,"nSlu",&local_480);
    if (iVar1 != 0) {
      (*lua_createtable)(L,0,0);
      iVar1 = (*lua_gettop)(L);
      (*lua_createtable)(L,0,0);
      iVar2 = (*lua_gettop)(L);
      (*lua_createtable)(L,0,0);
      iVar3 = (*lua_gettop)(L);
      (*lua_createtable)(L,0,0);
      iVar4 = (*lua_gettop)(L);
      pcVar5 = (*lua_getlocal)(L,&local_480,1);
      if (pcVar5 != (char *)0x0) {
        iVar6 = 2;
        do {
          if (*pcVar5 == '(') {
            (*lua_settop)(L,-2);
          }
          else {
            (*lua_setfield)(L,iVar3,pcVar5);
          }
          pcVar5 = (*lua_getlocal)(L,&local_480,iVar6);
          iVar6 = iVar6 + 1;
        } while (pcVar5 != (char *)0x0);
      }
      iVar3 = (*lua_getinfo)(L,"f",&local_480);
      if (iVar3 != 0) {
        iVar3 = (*lua_gettop)(L);
        pcVar5 = (*lua_getupvalue)(L,iVar3,1);
        if (pcVar5 != (char *)0x0) {
          iVar6 = 2;
          do {
            (*lua_setfield)(L,iVar4,pcVar5);
            pcVar5 = (*lua_getupvalue)(L,iVar3,iVar6);
            iVar6 = iVar6 + 1;
          } while (pcVar5 != (char *)0x0);
        }
        (*lua_settop)(L,-2);
      }
      iVar3 = (*lua_gettop)(L);
      if (iVar3 == iVar4) {
        (*lua_pushcclosure)(L,EnvIndexFunction,2);
        (*lua_setfield)(L,iVar2,"__index");
        (*lua_setmetatable)(L,iVar1);
        iVar2 = (*lua_gettop)(L);
        if (iVar2 == iVar1) {
          return true;
        }
        __assert_fail("top == env",
                      "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/emmy_debugger/src/debugger/emmy_debugger.cpp"
                      ,0x312,"bool Debugger::CreateEnv(lua_State *, int)");
      }
      __assert_fail("top == upvalues",
                    "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/emmy_debugger/src/debugger/emmy_debugger.cpp"
                    ,0x306,"bool Debugger::CreateEnv(lua_State *, int)");
    }
  }
  return false;
}

Assistant:

bool Debugger::CreateEnv(lua_State *L, int stackLevel) {
	if (!L) {
		return false;
	}


	//assert(L);
	//const auto L = L;

	lua_Debug ar{};
	if (!lua_getstack(L, stackLevel, &ar)) {
		return false;
	}
	if (!lua_getinfo(L, "nSlu", &ar)) {
		return false;
	}

	lua_newtable(L);
	const int env = lua_gettop(L);
	lua_newtable(L);
	const int envMetatable = lua_gettop(L);
	lua_newtable(L);
	const int locals = lua_gettop(L);
	lua_newtable(L);
	const int upvalues = lua_gettop(L);

	int idx = 1;
	// local values
	while (true) {
		const char *name = lua_getlocal(L, &ar, idx++);
		if (name == nullptr)
			break;
		if (name[0] == '(') {
			lua_pop(L, 1);
			continue;
		}
		lua_setfield(L, locals, name);
	}
	// up values
	if (lua_getinfo(L, "f", &ar)) {
		const int fIdx = lua_gettop(L);
		idx = 1;
		while (true) {
			const char *name = lua_getupvalue(L, fIdx, idx++);
			if (name == nullptr)
				break;
			lua_setfield(L, upvalues, name);
		}
		lua_pop(L, 1);
	}
	int top = lua_gettop(L);
	assert(top == upvalues);

	// index function
	// up value: locals, upvalues
	lua_pushcclosure(L, EnvIndexFunction, 2);

	// envMetatable.__index = EnvIndexFunction
	lua_setfield(L, envMetatable, "__index");
	// setmetatable(env, envMetatable)
	lua_setmetatable(L, env);

	top = lua_gettop(L);
	assert(top == env);
	return true;
}